

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

Promise<void> __thiscall
kj::anon_unknown_36::WebSocketPipeImpl::pumpToNoAbort(WebSocketPipeImpl *this,WebSocket *other)

{
  Coroutine<void> *this_00;
  long *plVar1;
  Promise<void> *pPVar2;
  PromiseAwaiter<void> *pPVar3;
  _func_int **pp_Var4;
  PromiseArenaMember *pPVar5;
  SourceLocation location;
  bool bVar6;
  coroutine_handle<void> coroutine;
  undefined8 uVar7;
  long lVar8;
  void *pvVar9;
  long *in_RDX;
  
  coroutine._M_fr_ptr = operator_new(0x5d8);
  *(code **)coroutine._M_fr_ptr = pumpToNoAbort;
  *(code **)((long)coroutine._M_fr_ptr + 8) = pumpToNoAbort;
  this_00 = (Coroutine<void> *)((long)coroutine._M_fr_ptr + 0x10);
  *(long **)((long)coroutine._M_fr_ptr + 0x5c0) = in_RDX;
  *(WebSocket **)((long)coroutine._M_fr_ptr + 0x5b8) = other;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x10) = &PTR_destroy_006e78f0;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x20) = &PTR_traceEvent_006e7938;
  location.function = "pumpToNoAbort";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  location.lineNumber = 0xf55;
  location.columnNumber = 0x15;
  kj::_::CoroutineBase::CoroutineBase
            ((CoroutineBase *)this_00,coroutine,
             (ExceptionOrValue *)((long)coroutine._M_fr_ptr + 0x98),location);
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x10) = &PTR_destroy_006e78f0;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x20) = &PTR_traceEvent_006e7938;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x98) = 0;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x230) = 0;
  (this->super_WebSocket)._vptr_WebSocket = (_func_int **)this_00;
  pp_Var4 = other[5]._vptr_WebSocket;
  if (pp_Var4 == (_func_int **)0x0) {
    pvVar9 = operator_new(0x400);
    pPVar3 = (PromiseAwaiter<void> *)((long)coroutine._M_fr_ptr + 0x3f0);
    pPVar2 = (Promise<void> *)((long)coroutine._M_fr_ptr + 0x5b0);
    *(undefined8 *)((long)pvVar9 + 0x218) = 0;
    *(undefined8 *)((long)pvVar9 + 0x220) = 0;
    *(undefined ***)((long)pvVar9 + 0x210) = &PTR_destroy_00703788;
    *(undefined ***)((long)pvVar9 + 0x228) = &PTR_reject_007037d8;
    *(undefined1 *)((long)pvVar9 + 0x230) = 0;
    *(undefined1 *)((long)pvVar9 + 0x3c8) = 0;
    *(undefined1 *)((long)pvVar9 + 0x3d0) = 1;
    *(undefined ***)((long)pvVar9 + 0x3d8) = &PTR_send_00703838;
    *(long *)((long)pvVar9 + 0x3e0) = (long)pvVar9 + 0x228;
    *(WebSocket **)((long)pvVar9 + 1000) = other;
    *(long **)((long)pvVar9 + 0x3f0) = in_RDX;
    *(undefined8 *)((long)pvVar9 + 0x3f8) = 0;
    other[5]._vptr_WebSocket = (_func_int **)((long)pvVar9 + 0x3d8);
    *(void **)((long)pvVar9 + 0x218) = pvVar9;
    (pPVar2->super_PromiseBase).node.ptr = (PromiseNode *)((long)pvVar9 + 0x210);
    co_await<void>(pPVar3,pPVar2);
    *(undefined1 *)((long)coroutine._M_fr_ptr + 0x5d0) = 1;
    bVar6 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                      ((PromiseAwaiterBase *)pPVar3,(CoroutineBase *)this_00);
    if (bVar6) {
      return (PromiseBase)(PromiseBase)this;
    }
    kj::_::PromiseAwaiter<void>::await_resume(pPVar3);
    if (*(char *)((long)coroutine._M_fr_ptr + 0x408) == '\x01') {
      Exception::~Exception((Exception *)((long)coroutine._M_fr_ptr + 0x410));
    }
    kj::_::PromiseAwaiterBase::~PromiseAwaiterBase((PromiseAwaiterBase *)pPVar3);
    pPVar5 = &((pPVar2->super_PromiseBase).node.ptr)->super_PromiseArenaMember;
    if (pPVar5 != (PromiseArenaMember *)0x0) {
      (pPVar2->super_PromiseBase).node.ptr = (PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose(pPVar5);
    }
  }
  else {
    uVar7 = (**(code **)(*in_RDX + 0x50))(in_RDX);
    pPVar2 = (Promise<void> *)((long)coroutine._M_fr_ptr + 0x5a8);
    *(undefined8 *)((long)coroutine._M_fr_ptr + 0x5c8) = uVar7;
    (**(code **)(*pp_Var4 + 0x38))(pPVar2,pp_Var4,in_RDX);
    pPVar3 = (PromiseAwaiter<void> *)((long)coroutine._M_fr_ptr + 0x238);
    co_await<void>(pPVar3,pPVar2);
    *(undefined1 *)((long)coroutine._M_fr_ptr + 0x5d0) = 0;
    bVar6 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                      ((PromiseAwaiterBase *)pPVar3,(CoroutineBase *)this_00);
    if (bVar6) {
      return (PromiseBase)(PromiseBase)this;
    }
    kj::_::PromiseAwaiter<void>::await_resume(pPVar3);
    if (*(char *)((long)coroutine._M_fr_ptr + 0x250) == '\x01') {
      Exception::~Exception((Exception *)((long)coroutine._M_fr_ptr + 600));
    }
    kj::_::PromiseAwaiterBase::~PromiseAwaiterBase((PromiseAwaiterBase *)pPVar3);
    pPVar5 = &((pPVar2->super_PromiseBase).node.ptr)->super_PromiseArenaMember;
    if (pPVar5 != (PromiseArenaMember *)0x0) {
      (pPVar2->super_PromiseBase).node.ptr = (PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose(pPVar5);
    }
    lVar8 = (**(code **)(**(long **)((long)coroutine._M_fr_ptr + 0x5c0) + 0x50))();
    plVar1 = (long *)(*(long *)((long)coroutine._M_fr_ptr + 0x5b8) + 0x40);
    *plVar1 = *plVar1 + (lVar8 - *(long *)((long)coroutine._M_fr_ptr + 0x5c8));
  }
  kj::_::Coroutine<void>::fulfill(this_00,(FixVoid<void> *)((long)coroutine._M_fr_ptr + 0x5d1));
  *(undefined8 *)coroutine._M_fr_ptr = 0;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x5d0) = 2;
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> pumpToNoAbort(WebSocket& other) {
    KJ_IF_SOME(s, state) {
      auto before = other.receivedByteCount();
      KJ_DEFER(transferredBytes += other.receivedByteCount() - before);
      co_await s.pumpTo(other);
    } else {
      co_await newAdaptedPromise<void, BlockedPumpTo>(*this, other);
    }
  }